

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewChange.h
# Opt level: O1

void __thiscall
NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::NewChangeBase(NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *this)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Tools *pTVar3;
  long *plVar4;
  size_type *psVar5;
  allocator<char> local_39;
  long *local_38 [2];
  long local_28 [2];
  
  this->_vptr_NewChangeBase = (_func_int **)&PTR_createObjectDirectory_0010fd40;
  (this->files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  pTVar3 = Tools::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,(pTVar3->path->_M_dataplus)._M_p,&local_39);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_38);
  (pbVar2->_M_dataplus)._M_p = (pointer)&pbVar2->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar1 = plVar4[3];
    (pbVar2->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&pbVar2->field_2 + 8) = lVar1;
  }
  else {
    (pbVar2->_M_dataplus)._M_p = (pointer)*plVar4;
    (pbVar2->field_2)._M_allocated_capacity = *psVar5;
  }
  pbVar2->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  this->path = pbVar2;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  this->path = pbVar2;
  (this->shortHashName)._M_dataplus._M_p = (pointer)&(this->shortHashName).field_2;
  (this->shortHashName)._M_string_length = 0;
  (this->shortHashName).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

NewChangeBase() : path(this->path = new string(string(Tools::getInstance()->path->data()) + ".stn")) {}